

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O0

cmFileLockResult __thiscall cmFileLockPool::ScopePool::Release(ScopePool *this,string *filename)

{
  bool bVar1;
  reference ppcVar2;
  cmFileLockResult cVar3;
  __normal_iterator<cmFileLock_**,_std::vector<cmFileLock_*,_std::allocator<cmFileLock_*>_>_>
  local_30;
  __normal_iterator<cmFileLock_**,_std::vector<cmFileLock_*,_std::allocator<cmFileLock_*>_>_>
  local_28;
  It i;
  string *filename_local;
  ScopePool *this_local;
  
  i._M_current = (cmFileLock **)filename;
  local_28._M_current =
       (cmFileLock **)std::vector<cmFileLock_*,_std::allocator<cmFileLock_*>_>::begin(&this->Locks);
  while( true ) {
    local_30._M_current =
         (cmFileLock **)std::vector<cmFileLock_*,_std::allocator<cmFileLock_*>_>::end(&this->Locks);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) {
      cVar3 = cmFileLockResult::MakeOk();
      return cVar3;
    }
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmFileLock_**,_std::vector<cmFileLock_*,_std::allocator<cmFileLock_*>_>_>
              ::operator*(&local_28);
    bVar1 = cmFileLock::IsLocked(*ppcVar2,(string *)i._M_current);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<cmFileLock_**,_std::vector<cmFileLock_*,_std::allocator<cmFileLock_*>_>_>::
    operator++(&local_28);
  }
  ppcVar2 = __gnu_cxx::
            __normal_iterator<cmFileLock_**,_std::vector<cmFileLock_*,_std::allocator<cmFileLock_*>_>_>
            ::operator*(&local_28);
  cVar3 = cmFileLock::Release(*ppcVar2);
  return cVar3;
}

Assistant:

cmFileLockResult cmFileLockPool::ScopePool::Release(
  const std::string& filename)
{
  for (It i = this->Locks.begin(); i != this->Locks.end(); ++i) {
    if ((*i)->IsLocked(filename)) {
      return (*i)->Release();
    }
  }
  return cmFileLockResult::MakeOk();
}